

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void kokkosp_print_help(char *exe)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"usage: ");
  poVar1 = std::operator<<(poVar1,exe);
  poVar1 = std::operator<<(poVar1,"[--kokkos-tools-args=<threshold>]\n");
  std::operator<<(poVar1,
                  "\nDefault value: 0.1\n\nDescription:\n  Provide a decimal threshold value of percent of parent time for output.  \n  Timers below this threshold will not be output.  Set to 0 to get unfiltered\n  reports.\n\nExample:\n  The following example would set the threshold to 10%\n    <exe> [--kokkos-tools-args=10 ]\n"
                 );
  return;
}

Assistant:

void kokkosp_print_help(const char* exe) {
  auto usage = R"usage(
Default value: 0.1

Description:
  Provide a decimal threshold value of percent of parent time for output.  
  Timers below this threshold will not be output.  Set to 0 to get unfiltered
  reports.

Example:
  The following example would set the threshold to 10%
    <exe> [--kokkos-tools-args=10 ]
)usage";
  std::cout << "usage: " << exe << "[--kokkos-tools-args=<threshold>]\n"
            << usage;
}